

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O2

void Omega_h::parallel_for<Omega_h::elements_across_sides_count_functor>
               (LO n,elements_across_sides_count_functor *f)

{
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_91;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_91);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x54);
  std::operator+(&local_30,&local_50,&local_90);
  begin_code("parallel_for",local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  for_each<Omega_h::IntIterator,Omega_h::elements_across_sides_count_functor&>
            ((IntIterator)0x0,(IntIterator)n,f);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return;
}

Assistant:

void parallel_for(LO n, UnaryFunction&& f) {
  OMEGA_H_TIME_FUNCTION;
  auto const first = IntIterator(0);
  auto const last = IntIterator(n);
  ::Omega_h::for_each(first, last, f);
}